

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initialalignment.cpp
# Opt level: O3

bool __thiscall Alignment::StaticAlignmentMean(Alignment *this)

{
  Vector3d *m;
  undefined8 *puVar1;
  double *dst;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 uVar5;
  ostream *poVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  Matrix3d *pMVar11;
  Alignment *this_00;
  ActualDstType actualDst_2;
  type lhs;
  byte bVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar13;
  double dVar14;
  Matrix3d observation;
  Matrix3d reference;
  DstEvaluatorType dstEvaluator;
  Matrix3d Cnb;
  SrcEvaluatorType srcEvaluator_1;
  assign_op<double,_double> local_2a9;
  double local_2a8;
  undefined8 uStack_2a0;
  double local_298;
  double local_288 [9];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  double local_228;
  double local_210;
  double dStack_208;
  double local_200;
  SrcXprType local_1f8;
  evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> local_1f0;
  double local_1e8 [5];
  double dStack_1c0;
  double local_1b8;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined1 local_188 [16];
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_178;
  double local_150;
  plainobjectbase_evaluator_data<double,_3> local_140;
  DstXprType local_138;
  SrcEvaluatorType local_f0;
  double local_88;
  
  bVar12 = 0;
  CalculateMean(this);
  m = this->Mean;
  poVar6 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)m);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_198 = 0xc0239655051512b7;
  dVar14 = Deg2Rad(30.5278);
  dVar14 = cos(dVar14);
  local_188._8_4_ = extraout_XMM0_Dc;
  local_188._0_8_ = dVar14;
  local_188._12_4_ = extraout_XMM0_Dd;
  dVar14 = Deg2Rad(30.5278);
  local_298 = sin(dVar14);
  local_298 = local_298 * -7.292115e-05;
  local_228 = (double)local_188._0_8_ * 7.292115e-05;
  uStack_2a0 = 0;
  local_2a8 = local_228;
  local_210 = local_298 * 0.0 + 0.0;
  dStack_208 = local_228 * -9.7936174 + local_298 * -0.0;
  local_200 = local_228 * -0.0 + 0.0;
  local_1e8[4] = local_210;
  dStack_1c0 = dStack_208;
  local_1b8 = local_200;
  local_288[3] = this->Mean[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0];
  local_288[0] = this->Mean[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0];
  dVar14 = this->Mean[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
           m_data.array[1];
  dVar2 = this->Mean[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[2];
  dVar3 = this->Mean[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[1];
  dVar4 = this->Mean[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
          m_data.array[2];
  dVar13 = dVar4 * dVar14 - dVar2 * dVar3;
  local_1e8[1] = local_288[3] * dVar2 - local_288[0] * dVar4;
  dVar14 = local_288[0] * dVar3 - local_288[3] * dVar14;
  local_1e8[0] = dVar13;
  local_1e8[2] = dVar14;
  local_240 = local_1a8;
  uStack_238 = uStack_1a0;
  local_230 = 0xc0239655051512b7;
  local_230 = 0xc0239655051512b7;
  if (((ulong)local_288 >> 3 & 1) == 0) {
    local_288[0] = (m->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                   m_data.array[0];
    local_288[1] = this->Mean[0].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[1];
    local_288[2] = dVar2;
  }
  else {
    uVar8 = (ulong)(((uint)((ulong)local_288 >> 3) & 1) << 3);
    puVar1 = (undefined8 *)
             ((long)(m->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
                    m_data.array + uVar8);
    uVar5 = puVar1[1];
    *(undefined8 *)((long)local_288 + uVar8) = *puVar1;
    *(undefined8 *)((long)local_288 + uVar8 + 8) = uVar5;
  }
  uVar7 = (int)local_288 + 0x18U >> 3 & 1;
  if (uVar7 == 0) {
    local_288[3] = this->Mean[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[0];
    local_288[4] = this->Mean[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array[1];
    local_288[5] = dVar4;
  }
  else {
    uVar8 = (ulong)(uVar7 << 3);
    puVar1 = (undefined8 *)
             ((long)this->Mean[1].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                    m_storage.m_data.array + uVar8);
    uVar5 = puVar1[1];
    *(undefined8 *)((long)local_288 + uVar8 + 0x18) = *puVar1;
    *(undefined8 *)((long)local_288 + uVar8 + 0x20) = uVar5;
  }
  uVar7 = (int)local_288 + 0x30U >> 3 & 1;
  if (uVar7 == 0) {
    local_288[6] = local_1e8[0];
    local_288[7] = local_1e8[1];
    local_288[8] = dVar14;
  }
  else {
    local_288[6] = dVar13;
    uVar8 = (ulong)(uVar7 << 3);
    uVar5 = *(undefined8 *)((long)local_1e8 + uVar8 + 8);
    *(undefined8 *)((long)local_288 + uVar8 + 0x30) = *(undefined8 *)((long)local_1e8 + uVar8);
    *(undefined8 *)((long)local_288 + uVar8 + 0x38) = uVar5;
  }
  local_1f8.m_xpr.m_matrix = (XprTypeNested)(non_const_type)&local_240;
  local_1f0.m_d.data =
       (plainobjectbase_evaluator_data<double,_3>)
       (plainobjectbase_evaluator_data<double,_3>)local_288;
  Eigen::internal::
  Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
  ::run((Matrix<double,_3,_3,_1,_3,_3> *)&local_f0,&local_1f8,
        (assign_op<double,_double> *)&local_178);
  local_f0.
  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhs.m_matrix = (non_const_type)local_1f0.m_d.data;
  local_f0.
  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_rhsImpl.
  super_unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
  .m_argImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>.m_d.
  data = (unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
          )(unary_evaluator<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::IndexBased,_double>
            )local_1f0.m_d.data;
  local_f0.
  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_innerDim = 3;
  local_178.m_dstExpr = &local_138;
  local_178.m_dst = (DstEvaluatorType *)&local_140;
  local_178.m_functor = &local_2a9;
  local_178.m_src = &local_f0;
  local_140.data = (double *)local_178.m_dstExpr;
  local_f0.
  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  .m_lhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>.m_d.
  data = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>)&local_f0;
  Eigen::internal::
  copy_using_evaluator_DefaultTraversal_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_0,_9>
  ::run(&local_178);
  pMVar11 = &this->Cbn;
  (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
       = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[0];
  (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1]
       = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[1];
  (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2]
       = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[2];
  (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3]
       = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[3];
  (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4]
       = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[4];
  (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5]
       = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[5];
  (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6]
       = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[6];
  (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7]
       = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[7];
  (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
       = local_138.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
         array[8];
  iVar10 = 0x1e;
  dst = local_f0.
        super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array +
        4;
  do {
    local_150 = 0.5;
    local_178.m_src = (SrcEvaluatorType *)pMVar11;
    local_178.m_functor = (assign_op<double,_double> *)pMVar11;
    local_f0.
    super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
         (double)pMVar11;
    local_f0.
    super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
    .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
         (double)dst;
    Eigen::internal::
    Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run((Matrix<double,_3,_3,_1,_3,_3> *)dst,(SrcXprType *)&local_178.m_functor,
          (assign_op<double,_double> *)&local_1f8);
    local_88 = local_150;
    (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [0] = ((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
            local_f0.
            super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[2])->m_storage).m_data.array[0] +
          *(double *)
           local_f0.
           super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
           .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
           array[3]) * local_150;
    (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [1] = ((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
            local_f0.
            super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[2])->m_storage).m_data.array[1] +
          *(double *)
           ((long)local_f0.
                  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[3] + 0x18)) * local_150;
    (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [2] = ((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
            local_f0.
            super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[2])->m_storage).m_data.array[2] +
          *(double *)
           ((long)local_f0.
                  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[3] + 0x30)) * local_150;
    (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [3] = ((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
            local_f0.
            super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[2])->m_storage).m_data.array[3] +
          *(double *)
           ((long)local_f0.
                  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[3] + 8)) * local_150;
    (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [4] = ((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
            local_f0.
            super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[2])->m_storage).m_data.array[4] +
          *(double *)
           ((long)local_f0.
                  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[3] + 0x20)) * local_150;
    (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [5] = ((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
            local_f0.
            super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[2])->m_storage).m_data.array[5] +
          *(double *)
           ((long)local_f0.
                  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[3] + 0x38)) * local_150;
    (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [6] = ((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
            local_f0.
            super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[2])->m_storage).m_data.array[6] +
          *(double *)
           ((long)local_f0.
                  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[3] + 0x10)) * local_150;
    (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [7] = ((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
            local_f0.
            super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[2])->m_storage).m_data.array[7] +
          *(double *)
           ((long)local_f0.
                  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[3] + 0x28)) * local_150;
    (this->Cbn).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [8] = ((((PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
            local_f0.
            super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
            .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
            array[2])->m_storage).m_data.array[8] +
          *(double *)
           ((long)local_f0.
                  super_product_evaluator<Eigen::Product<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                  .m_lhs.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                  m_data.array[3] + 0x40)) * local_150;
    iVar10 = iVar10 + -1;
  } while (iVar10 != 0);
  this_00 = (Alignment *)&stack0xffffffffffffff88;
  for (lVar9 = 9; lVar9 != 0; lVar9 = lVar9 + -1) {
    this_00->OriginData[0].
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)(pMVar11->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                  m_data.array[0];
    pMVar11 = (Matrix3d *)((long)pMVar11 + (ulong)bVar12 * -0x10 + 8);
    this_00 = (Alignment *)((long)this_00 + (ulong)bVar12 * -0x10 + 8);
  }
  CalculateEuler(this_00,(Matrix3d *)&stack0xffffffffffffff88,this->Euler_mean);
  return true;
}

Assistant:

bool Alignment::StaticAlignmentMean()
{
    this->CalculateMean();
    cout << this->Mean[0] << endl;
    Vector3d gn(0, 0, -GRAVITY);
    Vector3d Omega_n(OMEGA * cos(Deg2Rad(PHI)), 0, -OMEGA * sin(Deg2Rad(PHI)));
    Vector3d vn = gn.cross(Omega_n);
    Vector3d vb = this->Mean[0].cross(this->Mean[1]);

    Matrix3d reference;
    reference.block(0, 0, 3, 1) = gn;
    reference.block(0, 1, 3, 1) = Omega_n;
    reference.block(0, 2, 3, 1) = vn;
    
    Matrix3d observation;
    observation.block(0, 0, 3, 1) = this->Mean[0];
    observation.block(0, 1, 3, 1) = this->Mean[1];
    observation.block(0, 2, 3, 1) = vb;
    try
    {
        Matrix3d Cnb = reference.transpose().inverse() * observation.transpose();
        this->Cbn = Cnb;
        for(int i = 0; i < 30; ++i)
        {
            auto temp = (this->Cbn + (Cbn.transpose()).inverse()) * 0.5;
            this->Cbn = temp;
        }

        this->CalculateEuler(Cbn, this->Euler_mean);
    }
    catch(const std::exception& e)
    {
        std::cout << e.what() << '\n';
        return false;
    }

    return true;
}